

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O2

MessageAddressed * __thiscall
Network::RecvMsg(MessageAddressed *__return_storage_ptr__,Network *this,network_address_t dst)

{
  runtime_error *this_00;
  const_iterator __position;
  
  std::mutex::lock(&this->_mutex);
  __position._M_node = (_List_node_base *)this;
  do {
    __position._M_node =
         (((Network *)__position._M_node)->_messages).
         super__List_base<MessageAddressed,_std::allocator<MessageAddressed>_>._M_impl._M_node.
         super__List_node_base._M_next;
    if ((Network *)__position._M_node == this) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"no message for you");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  } while (*(int *)((long)&__position._M_node[1]._M_next + 4) != dst);
  MessageAddressed::MessageAddressed
            (__return_storage_ptr__,(MessageAddressed *)(__position._M_node + 1));
  std::__cxx11::list<MessageAddressed,_std::allocator<MessageAddressed>_>::erase
            (&this->_messages,__position);
  pthread_mutex_unlock((pthread_mutex_t *)&this->_mutex);
  return __return_storage_ptr__;
}

Assistant:

MessageAddressed Network::RecvMsg(network_address_t dst) {
    std::lock_guard<std::mutex> guard(_mutex);
    for (auto it = _messages.begin(); it !=_messages.end(); ++it)
    {
        if(it->dst == dst)
        {
            auto msg = * it;
            _messages.erase(it);
            return msg;
        }
    }
    throw std::runtime_error("no message for you");
}